

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filefind.cpp
# Opt level: O3

void __thiscall Am_Data_Locator::Remove_Search_Directory(Am_Data_Locator *this,Am_Filename *dir)

{
  _List_node_base *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _List_iterator<std::pair<Am_Filename,_unsigned_int>_> _Var4;
  search_pred local_48;
  
  _Var4._M_node =
       (this->search_list).
       super__List_base<std::pair<Am_Filename,_unsigned_int>,_std::allocator<std::pair<Am_Filename,_unsigned_int>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  paVar2 = &local_48.dirname.filename.field_2;
  pcVar3 = (dir->filename)._M_dataplus._M_p;
  local_48.dirname.filename._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar3,pcVar3 + (dir->filename)._M_string_length);
  _Var4 = std::find_if<std::_List_iterator<std::pair<Am_Filename,unsigned_int>>,search_pred>
                    (_Var4,(_List_iterator<std::pair<Am_Filename,_unsigned_int>_>)this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.dirname.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_48.dirname.filename._M_dataplus._M_p);
  }
  if (_Var4._M_node == (_List_node_base *)this) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Am_Data_Locator: removing search path ",0x26);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(dir->filename)._M_dataplus._M_p,
               (dir->filename)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," absent from search list",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
  }
  else {
    p_Var1 = _Var4._M_node + 3;
    *(int *)&p_Var1->_M_next = *(int *)&p_Var1->_M_next + -1;
    if (*(int *)&p_Var1->_M_next == 0) {
      std::__cxx11::
      list<std::pair<Am_Filename,_unsigned_int>,_std::allocator<std::pair<Am_Filename,_unsigned_int>_>_>
      ::_M_erase(&this->search_list,(iterator)_Var4._M_node);
    }
  }
  return;
}

Assistant:

void
Am_Data_Locator::Remove_Search_Directory(const Am_Filename &dir)
{
  dir_list_t::iterator it =
      std::find_if(search_list.begin(), search_list.end(), search_pred(dir));
  if (it != search_list.end()) {
    // Decreases the reference count of the directory
    --((*it).second);
    if ((*it).second == 0)
      search_list.erase(it); // and even deletes it if we reach 0
  } else
    std::cout << "Am_Data_Locator: removing search path " << dir
              << " absent from search list" << std::endl;
  return;
}